

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O2

double units::detail::convertTemperature<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  unit local_18;
  
  local_18.base_units_ = start->base_units_;
  if (((uint)local_18.base_units_ & 0x4fffffff) == 0x40010000) {
    local_18.multiplier_ = (float)start->multiplier_;
    bVar2 = unit::operator==((unit *)&degF,&local_18);
    if (bVar2) {
      val = ((val + -32.0) * 5.0) / 9.0;
    }
    else {
      dVar3 = start->multiplier_;
      if ((dVar3 != 1.0) || (NAN(dVar3))) {
        if ((29.5 <= dVar3) || (dVar3 < 0.0)) {
          val = val * dVar3;
        }
        else {
          val = val * dVar3 +
                convertTemperature<units::precise_unit,_units::precise_unit>::biasTable._M_elems
                [(int)dVar3];
        }
      }
    }
    dVar3 = val + 273.15;
  }
  else {
    dVar3 = val * start->multiplier_;
  }
  local_18.base_units_ = result->base_units_;
  if (((uint)local_18.base_units_ & 0x4fffffff) == 0x40010000) {
    dVar3 = dVar3 + -273.15;
    local_18.multiplier_ = (float)result->multiplier_;
    bVar2 = unit::operator==((unit *)&degF,&local_18);
    if (bVar2) {
      dVar3 = dVar3 * 1.8 + 32.0;
    }
    else {
      dVar1 = result->multiplier_;
      if ((dVar1 != 1.0) || (NAN(dVar1))) {
        if ((dVar1 < 29.5) && (0.0 <= dVar1)) {
          dVar3 = dVar3 - convertTemperature<units::precise_unit,_units::precise_unit>::biasTable.
                          _M_elems[(int)dVar1];
        }
        dVar3 = dVar3 / dVar1;
      }
    }
  }
  else {
    dVar3 = dVar3 / result->multiplier_;
  }
  return dVar3;
}

Assistant:

double convertTemperature(double val, const UX& start, const UX2& result)
    {
        static constexpr std::array<double, 30> biasTable{
            0.0, 0.0, 0.0, 0.0, 0.0,   0.0,   0.0, 0.0,     0.0, 0.0,
            0.0, 0.0, 0.0, 0.0, 121.0, 0.0,   0.0, 0.0,     0.0, 0.0,
            0.0, 0.0, 0.0, 0.0, 0.0,   150.0, 0.0, 37.7778, 0.0, 0.0};

        if (is_temperature(start)) {
            if (units::degF == unit_cast(start)) {
                val = (val - 32.0) * 5.0 / 9.0;
            } else if (start.multiplier() != 1.0) {
                if (start.multiplier() < 29.5 && start.multiplier() >= 0.0) {
                    val = val * start.multiplier() +
                        biasTable[static_cast<int>(start.multiplier())];
                } else {
                    val = val * start.multiplier();
                }
            }
            val += 273.15;
            // convert to K
        } else {
            val = val * start.multiplier();
        }
        if (is_temperature(result)) {
            val -= 273.15;
            if (units::degF == unit_cast(result)) {
                val *= 9.0 / 5.0;
                val += 32.0;
            } else if (result.multiplier() != 1.0) {
                if (result.multiplier() < 29.5 && result.multiplier() >= 0.0) {
                    val = (val -
                           biasTable[static_cast<int>(result.multiplier())]) /
                        result.multiplier();
                } else {
                    val = val / result.multiplier();
                }
            }
            return val;
        }
        return val / result.multiplier();
    }